

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.c
# Opt level: O1

void opt_j(opt_state_t *opt_state,edge *ep)

{
  int iVar1;
  block *pbVar2;
  uset pbVar3;
  uint uVar4;
  int iVar5;
  block **ppbVar6;
  block *pbVar7;
  int iVar8;
  long lVar9;
  bpf_u_int32 bVar10;
  long lVar11;
  
  pbVar2 = (ep->succ->et).succ;
  if (pbVar2 != (block *)0x0) {
    if (pbVar2 == (ep->succ->ef).succ) {
      if (pbVar2->out_use != 0) {
        lVar9 = 0;
        do {
          if (((pbVar2->out_use >> ((uint)lVar9 & 0x1f) & 1) != 0) &&
             (ep->pred->val[lVar9] != pbVar2->val[lVar9])) goto LAB_00115102;
          lVar9 = lVar9 + 1;
        } while (lVar9 != 0x12);
      }
      opt_state->done = 0;
      ep->succ = pbVar2;
    }
LAB_00115102:
    iVar1 = opt_state->edgewords;
    if (0 < (long)iVar1) {
      pbVar3 = ep->edom;
LAB_0011511d:
      lVar9 = 0;
      do {
        bVar10 = pbVar3[lVar9];
        iVar8 = 0;
        if (bVar10 != 0) {
          pbVar2 = ep->succ;
          do {
            uVar4 = 0;
            if (bVar10 != 0) {
              for (; (bVar10 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
              }
            }
            iVar8 = opt_state->edges[(int)(uVar4 | (int)lVar9 << 5)]->code;
            iVar5 = -iVar8;
            if (0 < iVar8) {
              iVar5 = iVar8;
            }
            if (((pbVar2->s).code == iVar5) &&
               (pbVar7 = opt_state->edges[(int)(uVar4 | (int)lVar9 << 5)]->pred,
               pbVar2->val[0x10] == pbVar7->val[0x10])) {
              if (pbVar2->oval == pbVar7->oval) {
                ppbVar6 = &(pbVar2->ef).succ;
                if (-1 < iVar8) {
                  ppbVar6 = &(pbVar2->et).succ;
                }
              }
              else {
                ppbVar6 = &(pbVar2->ef).succ;
                if (iVar5 != 0x15 || iVar8 < 0) goto LAB_001151d3;
              }
              pbVar7 = *ppbVar6;
            }
            else {
LAB_001151d3:
              pbVar7 = (block *)0x0;
            }
            if (pbVar7 != (block *)0x0) {
              if (pbVar7->out_use == 0) {
LAB_0011521d:
                opt_state->done = 0;
                ep->succ = pbVar7;
                iVar8 = 2 - (uint)((pbVar7->et).succ == (block *)0x0);
                break;
              }
              lVar11 = 0;
              while (((pbVar7->out_use >> ((uint)lVar11 & 0x1f) & 1) == 0 ||
                     (ep->pred->val[lVar11] == pbVar7->val[lVar11]))) {
                lVar11 = lVar11 + 1;
                if (lVar11 == 0x12) goto LAB_0011521d;
              }
            }
            bVar10 = bVar10 & ~(1 << (uVar4 & 0x1f));
            iVar8 = 0;
          } while (bVar10 != 0);
        }
        if (iVar8 != 0) goto LAB_0011524b;
        lVar9 = lVar9 + 1;
        if (lVar9 == iVar1) {
          return;
        }
      } while( true );
    }
  }
  return;
LAB_0011524b:
  if (iVar8 != 2) {
    return;
  }
  if (iVar1 < 1) {
    return;
  }
  goto LAB_0011511d;
}

Assistant:

static void
opt_j(opt_state_t *opt_state, struct edge *ep)
{
	register int i, k;
	register struct block *target;

	if (JT(ep->succ) == 0)
		return;

	if (JT(ep->succ) == JF(ep->succ)) {
		/*
		 * Common branch targets can be eliminated, provided
		 * there is no data dependency.
		 */
		if (!use_conflict(ep->pred, ep->succ->et.succ)) {
			opt_state->done = 0;
			ep->succ = JT(ep->succ);
		}
	}
	/*
	 * For each edge dominator that matches the successor of this
	 * edge, promote the edge successor to the its grandchild.
	 *
	 * XXX We violate the set abstraction here in favor a reasonably
	 * efficient loop.
	 */
 top:
	for (i = 0; i < opt_state->edgewords; ++i) {
		register bpf_u_int32 x = ep->edom[i];

		while (x != 0) {
			k = ffs(x) - 1;
			x &=~ (1 << k);
			k += i * BITS_PER_WORD;

			target = fold_edge(ep->succ, opt_state->edges[k]);
			/*
			 * Check that there is no data dependency between
			 * nodes that will be violated if we move the edge.
			 */
			if (target != 0 && !use_conflict(ep->pred, target)) {
				opt_state->done = 0;
				ep->succ = target;
				if (JT(target) != 0)
					/*
					 * Start over unless we hit a leaf.
					 */
					goto top;
				return;
			}
		}
	}
}